

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::IteratorIndexMethod::~IteratorIndexMethod(IteratorIndexMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~IteratorIndexMethod((IteratorIndexMethod *)0xac4148);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

IteratorIndexMethod() : SystemSubroutine(KnownSystemName::Index, SubroutineKind::Function) {}